

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall
FIX::HttpServer::onConnect(HttpServer *this,SocketServer *server,socket_handle a,socket_handle s)

{
  bool bVar1;
  ssize_t sVar2;
  socket_handle sVar3;
  undefined4 in_register_0000000c;
  undefined4 extraout_EDX;
  undefined4 uVar4;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 uVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  HttpConnection connection;
  HttpConnection local_2040;
  
  sVar3 = s;
  bVar1 = socket_isValid(s);
  if (bVar1) {
    uVar6 = (ulong)(uint)s;
    HttpConnection::HttpConnection(&local_2040,s);
    uVar4 = extraout_EDX;
    uVar5 = extraout_var;
    do {
      sVar2 = HttpConnection::read
                        (&local_2040,(int)uVar6,(void *)CONCAT44(uVar5,uVar4),
                         CONCAT44(in_register_0000000c,sVar3));
      uVar4 = extraout_EDX_00;
      uVar5 = extraout_var_00;
    } while ((char)sVar2 != '\0');
    SocketMonitor::drop(&this->m_pServer->m_monitor,s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2040.m_parser.m_buffer._M_dataplus._M_p != &local_2040.m_parser.m_buffer.field_2) {
      operator_delete(local_2040.m_parser.m_buffer._M_dataplus._M_p,
                      local_2040.m_parser.m_buffer.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void HttpServer::onConnect(SocketServer &server, socket_handle a, socket_handle s) {
  if (!socket_isValid(s)) {
    return;
  }
  HttpConnection connection(s);
  while (connection.read()) {}
  m_pServer->getMonitor().drop(s);
}